

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CopyTexSubImage2D::CopyTexSubImage2D
          (CopyTexSubImage2D *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,
          GLint level,GLint xoffset,GLint yoffset,GLint x,GLint y,GLsizei width,GLsizei height,
          bool useSync,bool serverSync)

{
  Texture *pTVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_50;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40;
  
  Operation::Operation(&this->super_Operation,"CopyTexSubImage2D",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CopyTexSubImage2D_01e00438;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  this->m_level = level;
  this->m_xoffset = xoffset;
  this->m_yoffset = yoffset;
  this->m_x = x;
  this->m_y = y;
  this->m_width = width;
  this->m_height = height;
  local_40.m_ptr = &((this->m_texture).m_ptr)->super_Object;
  local_40.m_state = (this->m_texture).m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_40);
  pTVar1 = (this->m_texture).m_ptr;
  local_50.m_ptr = &((pTVar1->sourceImage).m_ptr)->super_Object;
  if ((EGLImage *)local_50.m_ptr != (EGLImage *)0x0) {
    local_50.m_state = (pTVar1->sourceImage).m_state;
    if (local_50.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    Operation::modifyGLObject(&this->super_Operation,&local_50);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_50);
  }
  return;
}

Assistant:

CopyTexSubImage2D::CopyTexSubImage2D (SharedPtr<Texture> texture, GLint level, GLint xoffset, GLint yoffset, GLint x, GLint y, GLsizei width, GLsizei height, bool useSync, bool serverSync)
	: Operation		("CopyTexSubImage2D", useSync, serverSync)
	, m_texture		(texture)
	, m_level		(level)
	, m_xoffset		(xoffset)
	, m_yoffset		(yoffset)
	, m_x			(x)
	, m_y			(y)
	, m_width		(width)
	, m_height		(height)
{
	modifyGLObject(SharedPtr<Object>(m_texture));

	if (m_texture->sourceImage)
		modifyGLObject(SharedPtr<Object>(m_texture->sourceImage));
}